

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecdh_test.cc
# Opt level: O3

void __thiscall ECDHTest_WycheproofP224_Test::TestBody(ECDHTest_WycheproofP224_Test *this)

{
  function<void_(FileTest_*)> local_28;
  
  local_28.super__Function_base._M_functor._8_8_ = 0;
  local_28.super__Function_base._M_functor._M_unused._M_object = RunWycheproofTest;
  local_28._M_invoker = std::_Function_handler<void_(FileTest_*),_void_(*)(FileTest_*)>::_M_invoke;
  local_28.super__Function_base._M_manager =
       std::_Function_handler<void_(FileTest_*),_void_(*)(FileTest_*)>::_M_manager;
  FileTestGTest("third_party/wycheproof_testvectors/ecdh_secp224r1_test.txt",&local_28);
  if (local_28.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_28.super__Function_base._M_manager)
              ((_Any_data *)&local_28,(_Any_data *)&local_28,__destroy_functor);
  }
  return;
}

Assistant:

TEST(ECDHTest, WycheproofP224) {
  FileTestGTest("third_party/wycheproof_testvectors/ecdh_secp224r1_test.txt",
                RunWycheproofTest);
}